

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tlpperf.c
# Opt level: O0

void tlpperf_target_mode(size_t target_size)

{
  size_t __len;
  void *pvVar1;
  uintptr_t uVar2;
  ulong in_RDI;
  void *unaff_retaddr;
  size_t size;
  uintptr_t paddr;
  void *mem;
  
  __len = ((in_RDI >> 0xc) + 1) * 0x1000;
  pvVar1 = mmap((void *)0x0,__len,3,0x42022,-1,0);
  if (pvVar1 == (void *)0xffffffffffffffff) {
    fprintf(_stderr,"%s:ERR: failed to allocate %lu-byte from hugepage\n","tlpperf_target_mode",
            __len);
    perror("mmap");
    return;
  }
  uVar2 = phy_addr(unaff_retaddr);
  printf("%lu-byte allocated, physical address is %#lx\n",__len,uVar2);
  do {
    sleep(1);
  } while( true );
}

Assistant:

void tlpperf_target_mode(size_t target_size)
{
	/* target mode allocates 'size'-byte hugepage and wait forever */
	void *mem;
	uintptr_t paddr;
	size_t size = ((target_size >> 12) + 1) << 12;

	mem = mmap(0, size, PROT_READ | PROT_WRITE,
		   MAP_PRIVATE | MAP_ANONYMOUS | MAP_LOCKED | MAP_HUGETLB,
		   -1, 0);
	if (mem == MAP_FAILED) {
		pr_err("failed to allocate %lu-byte from hugepage\n", size);
		perror("mmap");
		return;
	}

	paddr = phy_addr(mem);
	printf("%lu-byte allocated, physical address is %#lx\n", size, paddr);

	while (1)
		sleep(1);
}